

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_writer.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
__thiscall
duckdb::StructColumnWriter::InitializeWriteState(StructColumnWriter *this,RowGroup *row_group)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer pCVar5;
  RowGroup *in_RDX;
  pointer *__ptr;
  pointer this_00;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::StructColumnWriterState_*,_false> local_48;
  __uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
  local_40;
  _Head_base<0UL,_duckdb::ColumnWriterState_*,_false> local_38;
  
  pCVar1 = (in_RDX->columns).
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar2 = (in_RDX->columns).
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38._M_head_impl = (ColumnWriterState *)this;
  local_48._M_head_impl = (StructColumnWriterState *)operator_new(0x98);
  ((local_48._M_head_impl)->super_ColumnWriterState).is_empty.
  super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((local_48._M_head_impl)->super_ColumnWriterState).is_empty.
  super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  ((local_48._M_head_impl)->super_ColumnWriterState).definition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_48._M_head_impl)->super_ColumnWriterState).definition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_48._M_head_impl)->super_ColumnWriterState).definition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_48._M_head_impl)->super_ColumnWriterState).repetition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_48._M_head_impl)->super_ColumnWriterState).repetition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_48._M_head_impl)->super_ColumnWriterState).repetition_levels.
  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&((local_48._M_head_impl)->super_ColumnWriterState).repetition_levels.
           super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&((local_48._M_head_impl)->super_ColumnWriterState).is_empty.
           super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
  ((local_48._M_head_impl)->super_ColumnWriterState).is_empty.
  super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  ((local_48._M_head_impl)->super_ColumnWriterState).parent_null_count = 0;
  ((local_48._M_head_impl)->super_ColumnWriterState).null_count = 0;
  ((local_48._M_head_impl)->super_ColumnWriterState)._vptr_ColumnWriterState =
       (_func_int **)&PTR__StructColumnWriterState_019e5be8;
  (local_48._M_head_impl)->row_group = in_RDX;
  (local_48._M_head_impl)->col_idx = ((long)pCVar1 - (long)pCVar2 >> 7) * -0x3333333333333333;
  ((local_48._M_head_impl)->child_states).
  super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_48._M_head_impl)->child_states).
  super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_48._M_head_impl)->child_states).
  super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar4 = unique_ptr<duckdb::StructColumnWriterState,_std::default_delete<duckdb::StructColumnWriterState>,_true>
           ::operator->((unique_ptr<duckdb::StructColumnWriterState,_std::default_delete<duckdb::StructColumnWriterState>,_true>
                         *)&local_48);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  ::reserve(&(pSVar4->child_states).
             super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
            ,(long)(row_group->sorting_columns).
                   super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                   .
                   super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)(row_group->sorting_columns).
                   super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                   .
                   super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                   ._M_impl.super__Vector_impl_data._M_finish >> 3);
  this_00 = (row_group->sorting_columns).
            super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
            .
            super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pSVar3 = (row_group->sorting_columns).
           super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
           .
           super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (this_00 != pSVar3) {
    do {
      pSVar4 = unique_ptr<duckdb::StructColumnWriterState,_std::default_delete<duckdb::StructColumnWriterState>,_true>
               ::operator->((unique_ptr<duckdb::StructColumnWriterState,_std::default_delete<duckdb::StructColumnWriterState>,_true>
                             *)&local_48);
      pCVar5 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
               operator->((unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                           *)this_00);
      (*pCVar5->_vptr_ColumnWriter[2])(&local_40,pCVar5);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
                  *)&pSVar4->child_states,
                 (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                  *)&local_40);
      if (local_40._M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
          .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
           )0x0) {
        (**(code **)(*(long *)local_40._M_t.
                              super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
                              .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>.
                              _M_head_impl + 8))();
      }
      this_00 = (pointer)&this_00->column_idx;
    } while (this_00 != pSVar3);
  }
  *(StructColumnWriterState **)local_38._M_head_impl = local_48._M_head_impl;
  return (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         (_Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
          )local_38._M_head_impl;
}

Assistant:

unique_ptr<ColumnWriterState> StructColumnWriter::InitializeWriteState(duckdb_parquet::RowGroup &row_group) {
	auto result = make_uniq<StructColumnWriterState>(row_group, row_group.columns.size());

	result->child_states.reserve(child_writers.size());
	for (auto &child_writer : child_writers) {
		result->child_states.push_back(child_writer->InitializeWriteState(row_group));
	}
	return std::move(result);
}